

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall
Regular::Regular(Regular *this,double rate,double shift,Time *time,string *name,string *type)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  allocator<char> local_41;
  double local_40;
  double local_38;
  string local_30;
  
  local_40 = rate;
  local_38 = shift;
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_00156aa0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Regular_00156b38;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Regular_00156b80;
  dVar1 = ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
           super_TimeDependent.xTime)->dt;
  lVar2 = (long)((1.0 / local_40) / dVar1);
  lVar3 = (long)(local_38 / dVar1);
  lVar4 = -1;
  if (lVar3 < 2) {
    lVar4 = lVar2;
  }
  this->regularInterval = lVar2;
  this->regularCount = lVar4 + lVar3;
  std::__cxx11::string::assign
            ((char *)&(this->super_StochasticEventGenerator).super_StochasticVariable.
                      super_StochasticProcess.stochDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"rate",&local_41);
  Parametric::addParameter((Parametric *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Regular::Regular(double rate, double shift, Time *time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	regularInterval = long(1.0 / rate / xTime->dt);
	long longShift = long(shift / xTime->dt);
	if (longShift>1)
		regularCount = longShift - 1;
	else
		regularCount = regularInterval + longShift;
	stochDescription = "regular counting process";
	addParameter("rate");
}